

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_test.cpp
# Opt level: O2

void __thiscall Hash_VarArgs_Test::TestBody(Hash_VarArgs_Test *this)

{
  char *message;
  long lVar1;
  AssertHelper local_68;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertionResult gtest_ar;
  int buf [4];
  
  buf[0] = 1;
  buf[1] = -0x30df;
  buf[2] = 0x1df5e0d;
  buf[3] = 0x25;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 4) {
    local_60.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         pbrt::MurmurHash64A((int *)((long)buf + lVar1),4,0);
    local_68.data_ = (AssertHelperData *)pbrt::Hash<int>(*(int *)((long)buf + lVar1));
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar,"HashBuffer(buf + i, sizeof(int))","Hash(buf[i])",
               (unsigned_long *)&local_60,(unsigned_long *)&local_68);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_60);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/hash_test.cpp"
                 ,0x10,message);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_60);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(Hash, VarArgs) {
    int buf[] = {1, -12511, 31415821, 37};
    for (int i = 0; i < 4; ++i)
        EXPECT_EQ(HashBuffer(buf + i, sizeof(int)), Hash(buf[i]));
}